

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagebox.cpp
# Opt level: O0

QList<QAbstractButton_*> * __thiscall
QtMWidgets::MessageBox::buttons
          (QList<QAbstractButton_*> *__return_storage_ptr__,MessageBox *this,ButtonRole role)

{
  bool bVar1;
  MessageBoxPrivate *pMVar2;
  ButtonRole *pBVar3;
  QAbstractButton **ppQVar4;
  const_iterator local_40;
  const_iterator last;
  const_iterator local_28;
  const_iterator it;
  ButtonRole role_local;
  MessageBox *this_local;
  QList<QAbstractButton_*> *list;
  
  it.i._M_node._3_1_ = 0;
  it.i._M_node._4_4_ = role;
  QList<QAbstractButton_*>::QList(__return_storage_ptr__);
  pMVar2 = QScopedPointer<QtMWidgets::MessageBoxPrivate,_QScopedPointerDeleter<QtMWidgets::MessageBoxPrivate>_>
           ::operator->(&this->d);
  local_28._M_node =
       (_Base_ptr)
       QMap<QAbstractButton_*,_QtMWidgets::MessageBox::ButtonRole>::constBegin(&pMVar2->buttonsMap);
  pMVar2 = QScopedPointer<QtMWidgets::MessageBoxPrivate,_QScopedPointerDeleter<QtMWidgets::MessageBoxPrivate>_>
           ::operator->(&this->d);
  local_40._M_node =
       (_Base_ptr)
       QMap<QAbstractButton_*,_QtMWidgets::MessageBox::ButtonRole>::constEnd(&pMVar2->buttonsMap);
  while (bVar1 = ::operator!=((const_iterator *)&local_28,(const_iterator *)&local_40), bVar1) {
    pBVar3 = QMap<QAbstractButton_*,_QtMWidgets::MessageBox::ButtonRole>::const_iterator::value
                       ((const_iterator *)&local_28);
    if (*pBVar3 == it.i._M_node._4_4_) {
      ppQVar4 = QMap<QAbstractButton_*,_QtMWidgets::MessageBox::ButtonRole>::const_iterator::key
                          ((const_iterator *)&local_28);
      QList<QAbstractButton_*>::append(__return_storage_ptr__,*ppQVar4);
    }
    QMap<QAbstractButton_*,_QtMWidgets::MessageBox::ButtonRole>::const_iterator::operator++
              ((const_iterator *)&local_28);
  }
  return __return_storage_ptr__;
}

Assistant:

QList< QAbstractButton* >
MessageBox::buttons( ButtonRole role ) const
{
	QList< QAbstractButton* > list;

	for( QMap< QAbstractButton*, ButtonRole >::const_iterator
		it = d->buttonsMap.constBegin(), last = d->buttonsMap.constEnd();
		it != last; ++it )
	{
		if( it.value() == role )
			list.append( it.key() );
	}

	return list;
}